

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

void __thiscall
QSocks5SocketEnginePrivate::parseAuthenticatingReply(QSocks5SocketEnginePrivate *this)

{
  QSocks5Authenticator *pQVar1;
  uint uVar2;
  QSocks5SocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool authComplete;
  QSocks5SocketEnginePrivate *in_stack_00000028;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  pQVar1 = in_RDI->data->authenticator;
  uVar2 = (*pQVar1->_vptr_QSocks5Authenticator[4])(pQVar1,in_RDI->data->controlSocket,&local_9);
  if ((uVar2 & 1) == 0) {
    reauthenticate(in_stack_00000028);
  }
  else if ((local_9 & 1) != 0) {
    sendRequestMethod(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEnginePrivate::parseAuthenticatingReply()
{
    bool authComplete = false;
    if (!data->authenticator->continueAuthenticate(data->controlSocket, &authComplete)) {
        reauthenticate();
        return;
    }
    if (authComplete)
        sendRequestMethod();
}